

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O2

void __thiscall
PushPopTest_SortTimeMeasurement_Test::PushPopTest_SortTimeMeasurement_Test
          (PushPopTest_SortTimeMeasurement_Test *this)

{
  PushPopTest::PushPopTest(&this->super_PushPopTest);
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.super_Test._vptr_Test =
       (_func_int **)&PTR__PushPopTest_00161b30;
  (this->super_PushPopTest).super_TestWithParam<unsigned_long>.
  super_WithParamInterface<unsigned_long>._vptr_WithParamInterface =
       (_func_int **)&PTR__PushPopTest_SortTimeMeasurement_Test_00161b70;
  return;
}

Assistant:

TEST_P(PushPopTest, SortTimeMeasurement) {
    std::size_t n = GetParam();

    resetRandom();
    MEASURE_TIME_BEGIN(stdDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        stdDeque.push_back(x);
        int y = nextRandom();
        stdDeque.push_front(y);
    }

    std::sort(stdDeque.begin(), stdDeque.end());
    MEASURE_TIME_END(stdDequeMs);

    resetRandom();
    MEASURE_TIME_BEGIN(myDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
    }

    std::sort(myDeque.begin(), myDeque.end());
    MEASURE_TIME_END(myDequeMs);

    auto p = std::mismatch(myDeque.begin(), myDeque.end(), stdDeque.begin());
    ASSERT_EQ(p.first, myDeque.end());

    std::cout   << "std::deque time: " << stdDequeMs << " ms." << std::endl
                << "My Deque time: " << myDequeMs << " ms." << std::endl;

}